

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskNode.cpp
# Opt level: O3

ostream * operator<<(ostream *out,TaskNode *taskNode)

{
  _List_node_base *p_Var1;
  ostream *poVar2;
  const_iterator __end1;
  _List_node_base *p_Var3;
  char local_29;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Task: ",6);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(taskNode->name)._M_dataplus._M_p,(taskNode->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,". Dependants: ",0xe);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  p_Var3 = (taskNode->dependant).super__List_base<TaskNode_*,_std::allocator<TaskNode_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)&taskNode->dependant) {
    do {
      p_Var1 = p_Var3[1]._M_next;
      local_29 = '\n';
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,&local_29,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,(char *)p_Var1->_M_next,(long)p_Var1->_M_prev);
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)&taskNode->dependant);
  }
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const TaskNode &taskNode) {
    out << "Task: " << taskNode.name << ". Dependants: " << taskNode.dependant.size();

    for (TaskNode *dependant : taskNode.dependant) {
        out << '\n' << dependant->getName();
    }

    return out;
}